

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridtestExternalTests.cpp
# Opt level: O2

bool __thiscall ExternalTester::testAllPWLocal(ExternalTester *this)

{
  TwoOneExpNX2 *f;
  int iVar1;
  bool bVar2;
  bool bVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  int i;
  long lVar9;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  initializer_list<double> __l_02;
  undefined8 in_stack_fffffffffffffe48;
  TypeOneDRule rule;
  vector<double,_std::allocator<double>_> tols1;
  allocator_type local_189;
  vector<int,_std::allocator<int>_> depths1;
  vector<double,_std::allocator<double>_> vals;
  vector<double,_std::allocator<double>_> y;
  vector<double,_std::allocator<double>_> pnts;
  TasmanianSparseGrid grid;
  
  rule = (TypeOneDRule)((ulong)in_stack_fffffffffffffe48 >> 0x20);
  _grid = 8;
  std::vector<int,_std::allocator<int>_>::vector
            (&depths1,0x1e,(value_type_conflict2 *)&grid,(allocator_type *)&tols1);
  memcpy(&grid,&DAT_0013e720,0xf0);
  __l._M_len = 0x1e;
  __l._M_array = (iterator)&grid;
  std::vector<double,_std::allocator<double>_>::vector(&tols1,__l,(allocator_type *)&vals);
  f = &this->f21nx2;
  bVar2 = testLocalPolynomialRule
                    (this,&f->super_BaseFunction,rule_semilocalp,
                     depths1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     tols1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start);
  if (bVar2) {
    if (this->verbose != true) goto LAB_0011c987;
    *(undefined8 *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) = 10;
    poVar4 = std::operator<<((ostream *)&std::cout,"Rule");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0x23;
    TasGrid::IO::getRuleString_abi_cxx11_(rule);
    poVar4 = std::operator<<(poVar4,(string *)&grid);
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0xf;
    poVar4 = std::operator<<(poVar4,"Pass");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  else {
    *(undefined8 *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) = 10;
    poVar4 = std::operator<<((ostream *)&std::cout,"Rule");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0x23;
    TasGrid::IO::getRuleString_abi_cxx11_(rule);
    poVar4 = std::operator<<(poVar4,(string *)&grid);
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0xf;
    poVar4 = std::operator<<(poVar4,"FAIL");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  std::__cxx11::string::~string((string *)&grid);
LAB_0011c987:
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&tols1.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&depths1.super__Vector_base<int,_std::allocator<int>_>);
  _grid = 8;
  std::vector<int,_std::allocator<int>_>::vector
            (&depths1,0x1e,(value_type_conflict2 *)&grid,(allocator_type *)&tols1);
  memcpy(&grid,&DAT_0013e720,0xf0);
  __l_00._M_len = 0x1e;
  __l_00._M_array = (iterator)&grid;
  std::vector<double,_std::allocator<double>_>::vector(&tols1,__l_00,(allocator_type *)&vals);
  bVar3 = testLocalPolynomialRule
                    (this,&f->super_BaseFunction,rule_localp,
                     depths1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     tols1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start);
  if (bVar3) {
    if (this->verbose == true) {
      *(undefined8 *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) = 10;
      poVar4 = std::operator<<((ostream *)&std::cout,"Rule");
      *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0x23;
      TasGrid::IO::getRuleString_abi_cxx11_(rule);
      poVar4 = std::operator<<(poVar4,(string *)&grid);
      *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0xf;
      poVar4 = std::operator<<(poVar4,"Pass");
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::~string((string *)&grid);
    }
  }
  else {
    *(undefined8 *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) = 10;
    poVar4 = std::operator<<((ostream *)&std::cout,"Rule");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0x23;
    TasGrid::IO::getRuleString_abi_cxx11_(rule);
    poVar4 = std::operator<<(poVar4,(string *)&grid);
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0xf;
    poVar4 = std::operator<<(poVar4,"FAIL");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&grid);
    bVar2 = false;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&tols1.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&depths1.super__Vector_base<int,_std::allocator<int>_>);
  _grid = 8;
  std::vector<int,_std::allocator<int>_>::vector
            (&depths1,0x1e,(value_type_conflict2 *)&grid,(allocator_type *)&tols1);
  memcpy(&grid,&DAT_0013e810,0xf0);
  __l_01._M_len = 0x1e;
  __l_01._M_array = (iterator)&grid;
  std::vector<double,_std::allocator<double>_>::vector(&tols1,__l_01,(allocator_type *)&vals);
  bVar3 = testLocalPolynomialRule
                    (this,&(this->f21sincosaxis).super_BaseFunction,rule_localpb,
                     depths1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     tols1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start);
  if (bVar3) {
    if (this->verbose == true) {
      *(undefined8 *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) = 10;
      poVar4 = std::operator<<((ostream *)&std::cout,"Rule");
      *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0x23;
      TasGrid::IO::getRuleString_abi_cxx11_(rule);
      poVar4 = std::operator<<(poVar4,(string *)&grid);
      *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0xf;
      poVar4 = std::operator<<(poVar4,"Pass");
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::~string((string *)&grid);
    }
  }
  else {
    *(undefined8 *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) = 10;
    poVar4 = std::operator<<((ostream *)&std::cout,"Rule");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0x23;
    TasGrid::IO::getRuleString_abi_cxx11_(rule);
    poVar4 = std::operator<<(poVar4,(string *)&grid);
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0xf;
    poVar4 = std::operator<<(poVar4,"FAIL");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&grid);
    bVar2 = false;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&tols1.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&depths1.super__Vector_base<int,_std::allocator<int>_>);
  _grid = 8;
  std::vector<int,_std::allocator<int>_>::vector
            (&depths1,0x1e,(value_type_conflict2 *)&grid,(allocator_type *)&tols1);
  memcpy(&grid,&DAT_0013e900,0xf0);
  __l_02._M_len = 0x1e;
  __l_02._M_array = (iterator)&grid;
  std::vector<double,_std::allocator<double>_>::vector(&tols1,__l_02,(allocator_type *)&vals);
  bVar3 = testLocalPolynomialRule
                    (this,&(this->f21coscos).super_BaseFunction,rule_localp0,
                     depths1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     tols1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start);
  if (bVar3) {
    if (this->verbose == true) {
      *(undefined8 *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) = 10;
      poVar4 = std::operator<<((ostream *)&std::cout,"Rule");
      *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0x23;
      TasGrid::IO::getRuleString_abi_cxx11_(rule);
      poVar4 = std::operator<<(poVar4,(string *)&grid);
      *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0xf;
      poVar4 = std::operator<<(poVar4,"Pass");
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::~string((string *)&grid);
    }
  }
  else {
    *(undefined8 *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) = 10;
    poVar4 = std::operator<<((ostream *)&std::cout,"Rule");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0x23;
    TasGrid::IO::getRuleString_abi_cxx11_(rule);
    poVar4 = std::operator<<(poVar4,(string *)&grid);
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0xf;
    poVar4 = std::operator<<(poVar4,"FAIL");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&grid);
    bVar2 = false;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&tols1.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&depths1.super__Vector_base<int,_std::allocator<int>_>);
  depths1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  depths1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  depths1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  TasGrid::makeLocalPolynomialGrid
            ((TasGrid *)&grid,2,1,4,1,rule_localp,
             (vector<int,_std::allocator<int>_> *)
             &depths1.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&depths1.super__Vector_base<int,_std::allocator<int>_>);
  depths1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  depths1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  depths1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tols1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  tols1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tols1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  genRandom(&pnts,10,2);
  TasGrid::TasmanianSparseGrid::evaluateSparseHierarchicalFunctions
            ((vector *)&grid,(vector *)&pnts,(vector *)&tols1,(vector *)&depths1);
  y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  getError(this,&f->super_BaseFunction,&grid,type_internal_interpolation,&y);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&y.super__Vector_base<double,_std::allocator<double>_>);
  lVar5 = TasGrid::TasmanianSparseGrid::getHierarchicalCoefficients();
  std::vector<double,_std::allocator<double>_>::vector(&y,10,&local_189);
  TasGrid::TasmanianSparseGrid::evaluateBatch
            ((double *)&grid,
             (int)pnts.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,(double *)0xa);
  lVar9 = 0;
  while (lVar6 = lVar9, lVar6 != 10) {
    iVar1 = *(int *)((long)tols1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar6 * 4 + 4);
    for (lVar7 = (long)*(int *)((long)tols1.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start + lVar6 * 4);
        lVar9 = lVar6 + 1, lVar7 < iVar1; lVar7 = lVar7 + 1) {
      y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [lVar6] = y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar6] -
                *(double *)
                 (lVar5 + (long)depths1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar7] * 8) *
                vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar7];
    }
  }
  for (lVar9 = 0; lVar9 != 10; lVar9 = lVar9 + 1) {
    if (1e-12 < ABS(y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar9])) {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "Error in evaluateSparseHierarchicalFunctions() (localp)");
      std::endl<char,std::char_traits<char>>(poVar4);
      bVar2 = false;
    }
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&y.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&pnts.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&vals.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&tols1);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&depths1.super__Vector_base<int,_std::allocator<int>_>);
  TasGrid::TasmanianSparseGrid::~TasmanianSparseGrid(&grid);
  *(undefined8 *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) = 0xb;
  poVar4 = std::operator<<((ostream *)&std::cout,"Rules");
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0x22;
  poVar4 = std::operator<<(poVar4,"local polynomial");
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0xf;
  pcVar8 = "FAIL";
  if (bVar2 != false) {
    pcVar8 = "Pass";
  }
  poVar4 = std::operator<<(poVar4,pcVar8);
  std::endl<char,std::char_traits<char>>(poVar4);
  return bVar2;
}

Assistant:

bool ExternalTester::testAllPWLocal() const{
    bool pass = true;
    int wfirst = 10, wsecond = 35, wthird = 15;

    { TasGrid::TypeOneDRule oned = TasGrid::rule_semilocalp;
      const std::vector<int> depths1(30, 8);
      // Tolerances for semi-local quadrature (column 1), interpolation (columns 2-3), and differentiation (columns 4-5).
      const std::vector<double> tols1 = { 1.E-03, 5.E-01, 5.E-01, 5.E-01, 5.E-01, // order 0
                                          1.E-03, 1.E-03, 1.E-03, 1.E-01, 1.E-01, // order 1
                                          1.E-07, 1.E-04, 1.E-04, 1.E-03, 1.E-03, // order 2
                                          1.E-07, 1.E-05, 1.E-05, 1.E-04, 1.E-04, // order 3
                                          1.E-07, 4.E-06, 4.E-06, 4.E-05, 4.E-05, // order 4
                                          1.E-07, 4.E-06, 4.E-06, 4.E-05, 4.E-05 }; // order -1
      if (testLocalPolynomialRule(&f21nx2, oned, depths1.data(), tols1.data())){
          if (verbose) cout << setw(wfirst) << "Rule" << setw(wsecond) << IO::getRuleString(oned) << setw(wthird) << "Pass" << endl;
      }else{
          cout << setw(wfirst) << "Rule" << setw(wsecond) << IO::getRuleString(oned) << setw(wthird) << "FAIL" << endl; pass = false;
      }
    }
    { TasGrid::TypeOneDRule oned = TasGrid::rule_localp;
      const std::vector<int> depths1(30, 8);
      // Tolerances for local quadrature (column 1), interpolation (columns 2-3), and differentiation (columns 4-5).
      const std::vector<double> tols1 = { 1.E-03, 5.E-01, 5.E-01, 5.E-01, 5.E-01, // order 0
                                          1.E-03, 1.E-03, 1.E-03, 1.E-01, 1.E-01, // order 1
                                          1.E-07, 1.E-04, 1.E-04, 1.E-03, 1.E-03, // order 2
                                          1.E-07, 1.E-05, 1.E-05, 1.E-04, 1.E-04, // order 3
                                          1.E-07, 4.E-06, 4.E-06, 4.E-05, 4.E-05, // order 4
                                          1.E-07, 4.E-06, 4.E-06, 4.E-05, 4.E-05 }; // order -1
      if (testLocalPolynomialRule(&f21nx2, oned, depths1.data(), tols1.data())){
          if (verbose) cout << setw(wfirst) << "Rule" << setw(wsecond) << IO::getRuleString(oned) << setw(wthird) << "Pass" << endl;
      }else{
          cout << setw(wfirst) << "Rule" << setw(wsecond) << IO::getRuleString(oned) << setw(wthird) << "FAIL" << endl; pass = false;
      }
    }
    { TasGrid::TypeOneDRule oned = TasGrid::rule_localpb;
      const std::vector<int> depths1(30, 8);
      // Tolerances for local-boundary quadrature (column 1), interpolation (columns 2-3), and differentiation (columns 4-5).
      const std::vector<double> tols1 = { 1.E-03, 5.E-01, 5.E-01, 5.E-01, 5.E-01, // order 0
                                          1.E-03, 1.E-03, 1.E-03, 5.E-01, 5.E-01, // order 1
                                          1.E-07, 1.E-04, 1.E-04, 1.E-02, 1.E-02, // order 2
                                          1.E-07, 1.E-05, 1.E-05, 1.E-03, 1.E-03, // order 3
                                          1.E-07, 9.E-06, 9.E-06, 9.E-05, 9.E-05, // order 4
                                          1.E-06, 2.E-05, 2.E-05, 2.E-04, 2.E-04 }; // order -1
      if (testLocalPolynomialRule(&f21sincosaxis, oned, depths1.data(), tols1.data())){
          if (verbose) cout << setw(wfirst) << "Rule" << setw(wsecond) << IO::getRuleString(oned) << setw(wthird) << "Pass" << endl;
      }else{
          cout << setw(wfirst) << "Rule" << setw(wsecond) << IO::getRuleString(oned) << setw(wthird) << "FAIL" << endl; pass = false;
      }
    }
    { TasGrid::TypeOneDRule oned = TasGrid::rule_localp0;
      const std::vector<int> depths1(30, 8);
      // Tolerances for local-zero quadrature (column 1), interpolation (columns 2-3), and differentiation (columns 4-5).
      const std::vector<double> tols1 = { 1.E-03, 5.E-01, 5.E-01, 5.E-01, 5.E-01, // order 0
                                          1.E-03, 2.E-04, 2.E-04, 2.E-02, 2.E-02, // order 1
                                          1.E-09, 1.E-06, 1.E-06, 1.E-04, 1.E-04, // order 2
                                          1.E-09, 3.E-08, 3.E-08, 3.E-06, 3.E-06, // order 3
                                          1.E-09, 4.E-09, 4.E-09, 4.E-08, 4.E-08, // order 4
                                          1.E-09, 4.E-09, 4.E-09, 4.E-08, 4.E-08}; // order -1
      if (testLocalPolynomialRule(&f21coscos, oned, depths1.data(), tols1.data())){
          if (verbose) cout << setw(wfirst) << "Rule" << setw(wsecond) << IO::getRuleString(oned) << setw(wthird) << "Pass" << endl;
      }else{
          cout << setw(wfirst) << "Rule" << setw(wsecond) << IO::getRuleString(oned) << setw(wthird) << "FAIL" << endl; pass = false;
      }
    }
    { TasGrid::TasmanianSparseGrid grid = makeLocalPolynomialGrid(2, 1, 4, 1);
        std::vector<int> indx, pntr;
        std::vector<double> vals;
        std::vector<double> pnts = genRandom(10, 2);
        grid.evaluateSparseHierarchicalFunctions(pnts, pntr, indx, vals);
        getError(&f21nx2, grid, type_internal_interpolation); // this is done to load the values
        const double *coeff = grid.getHierarchicalCoefficients();
        std::vector<double> y(10);
        grid.evaluateBatch(pnts.data(), 10, y.data());
        for(int i=0; i<10; i++){
            for(int j=pntr[i]; j<pntr[i+1]; j++){
                y[i] -= coeff[indx[j]] * vals[j];
            }
        }
        for(int i=0; i<10; i++){
            if (std::abs(y[i]) > Maths::num_tol){
                cout << "Error in evaluateSparseHierarchicalFunctions() (localp)" << endl;
                pass = false;
            }
        }
    }
    wfirst = 11; wsecond = 34;
    if (pass){
        cout << setw(wfirst) << "Rules" << setw(wsecond) << "local polynomial" << setw(wthird) << "Pass" << endl;
    }else{
        cout << setw(wfirst) << "Rules" << setw(wsecond) << "local polynomial" << setw(wthird) << "FAIL" << endl;
    }
    return pass;
}